

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

bool StringFormatter<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
     output_null<std::vector<unsigned_long,std::allocator<unsigned_long>>>
               (ostream *os,vector<unsigned_long,_std::allocator<unsigned_long>_> *value)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *value_local;
  ostream *os_local;
  
  return false;
}

Assistant:

static bool output_null(std::ostream& os, T value)
    {
        if constexpr (std::is_pointer_v<T> || std::is_null_pointer_v<T>) {
            if (value)
                return false;
            os << "(null)";
            return true;
        }
        return false;
    }